

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::OurReader::skipCommentTokens(OurReader *this,Token *token)

{
  Token *token_local;
  OurReader *this_local;
  
  if (((this->features_).allowComments_ & 1U) == 0) {
    readToken(this,token);
  }
  else {
    do {
      readToken(this,token);
    } while (token->type_ == tokenComment);
  }
  return;
}

Assistant:

void OurReader::skipCommentTokens(Token& token) {
  if (features_.allowComments_) {
    do {
      readToken(token);
    } while (token.type_ == tokenComment);
  } else {
    readToken(token);
  }
}